

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol_bindings.cpp
# Opt level: O0

void __thiscall PyServerSession::on_invalid_packet(PyServerSession *this)

{
  bool bVar1;
  object local_40;
  object o;
  handle local_28;
  function overload;
  gil_scoped_acquire gil;
  PyServerSession *this_local;
  
  pybind11::gil_scoped_acquire::gil_scoped_acquire((gil_scoped_acquire *)&overload);
  pybind11::get_overload<ki::protocol::net::ServerSession>
            ((pybind11 *)&local_28,&this->super_ServerSession,"on_invalid_packet");
  bVar1 = pybind11::handle::operator_cast_to_bool(&local_28);
  if (bVar1) {
    pybind11::detail::object_api<pybind11::handle>::operator()
              ((object_api<pybind11::handle> *)&local_40);
    pybind11::detail::cast_safe<void>(&local_40);
    pybind11::object::~object(&local_40);
  }
  pybind11::function::~function((function *)&local_28);
  pybind11::gil_scoped_acquire::~gil_scoped_acquire((gil_scoped_acquire *)&overload);
  if (!bVar1) {
    ki::protocol::net::Session::on_invalid_packet
              ((Session *)
               ((long)&(this->super_ServerSession)._vptr_ServerSession +
               (long)(this->super_ServerSession)._vptr_ServerSession[-3]));
  }
  return;
}

Assistant:

PYBIND11_OVERLOAD(
            void, ki::protocol::net::ServerSession,
            on_invalid_packet, );
    }
    void on_application_message(const ki::protocol::net::PacketHeader &header) override
    {
        PYBIND11_OVERLOAD(
            void, ki::protocol::net::ServerSession,
            on_application_message, header);
    }